

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  bool bVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  char cVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  float fVar39;
  float fVar40;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float fVar50;
  float fVar52;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar51;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar49 [16];
  float fVar62;
  float fVar63;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  undefined1 auVar61 [16];
  vint4 ai_3;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  vint4 bi;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  vint4 ai;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  vint4 ai_1;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  NodeRef stack [244];
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar26 = local_7d0;
  local_7d8 = root.ptr;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar69 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar70 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar86 = fVar69 * 0.99999964;
  fVar87 = fVar70 * 0.99999964;
  fVar81 = fVar76 * 0.99999964;
  fVar69 = fVar69 * 1.0000004;
  fVar70 = fVar70 * 1.0000004;
  fVar76 = fVar76 * 1.0000004;
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar11 = (tray->tnear).field_0.i[k];
  iVar12 = (tray->tfar).field_0.i[k];
LAB_0028897b:
  do {
    bVar14 = puVar26 != &local_7d8;
    if (puVar26 == &local_7d8) {
      return bVar14;
    }
    uVar25 = puVar26[-1];
    puVar26 = puVar26 + -1;
    while ((uVar25 & 8) == 0) {
      fVar13 = *(float *)(ray + k * 4 + 0x70);
      uVar22 = (uint)uVar25 & 7;
      uVar21 = uVar25 & 0xfffffffffffffff0;
      if (uVar22 == 3) {
        fVar71 = 1.0 - fVar13;
        fVar72 = fVar71 * 0.0;
        auVar60._0_4_ =
             fVar8 * *(float *)(uVar21 + 0x20) +
             fVar9 * *(float *)(uVar21 + 0x50) + fVar10 * *(float *)(uVar21 + 0x80);
        auVar60._4_4_ =
             fVar8 * *(float *)(uVar21 + 0x24) +
             fVar9 * *(float *)(uVar21 + 0x54) + fVar10 * *(float *)(uVar21 + 0x84);
        auVar60._8_4_ =
             fVar8 * *(float *)(uVar21 + 0x28) +
             fVar9 * *(float *)(uVar21 + 0x58) + fVar10 * *(float *)(uVar21 + 0x88);
        auVar60._12_4_ =
             fVar8 * *(float *)(uVar21 + 0x2c) +
             fVar9 * *(float *)(uVar21 + 0x5c) + fVar10 * *(float *)(uVar21 + 0x8c);
        auVar66._0_4_ =
             fVar8 * *(float *)(uVar21 + 0x30) +
             fVar9 * *(float *)(uVar21 + 0x60) + fVar10 * *(float *)(uVar21 + 0x90);
        auVar66._4_4_ =
             fVar8 * *(float *)(uVar21 + 0x34) +
             fVar9 * *(float *)(uVar21 + 100) + fVar10 * *(float *)(uVar21 + 0x94);
        auVar66._8_4_ =
             fVar8 * *(float *)(uVar21 + 0x38) +
             fVar9 * *(float *)(uVar21 + 0x68) + fVar10 * *(float *)(uVar21 + 0x98);
        auVar66._12_4_ =
             fVar8 * *(float *)(uVar21 + 0x3c) +
             fVar9 * *(float *)(uVar21 + 0x6c) + fVar10 * *(float *)(uVar21 + 0x9c);
        fVar77 = (float)DAT_01f80d30;
        fVar78 = DAT_01f80d30._4_4_;
        fVar79 = DAT_01f80d30._8_4_;
        fVar80 = DAT_01f80d30._12_4_;
        auVar67._4_4_ = -(uint)(ABS(auVar60._4_4_) < fVar78);
        auVar67._0_4_ = -(uint)(ABS(auVar60._0_4_) < fVar77);
        auVar67._8_4_ = -(uint)(ABS(auVar60._8_4_) < fVar79);
        auVar67._12_4_ = -(uint)(ABS(auVar60._12_4_) < fVar80);
        auVar59 = blendvps(auVar60,_DAT_01f80d30,auVar67);
        auVar89._4_4_ = -(uint)(ABS(auVar66._4_4_) < fVar78);
        auVar89._0_4_ = -(uint)(ABS(auVar66._0_4_) < fVar77);
        auVar89._8_4_ = -(uint)(ABS(auVar66._8_4_) < fVar79);
        auVar89._12_4_ = -(uint)(ABS(auVar66._12_4_) < fVar80);
        auVar67 = blendvps(auVar66,_DAT_01f80d30,auVar89);
        local_938 = (float)*(undefined8 *)(uVar21 + 0x70);
        fStack_934 = (float)((ulong)*(undefined8 *)(uVar21 + 0x70) >> 0x20);
        fStack_930 = (float)*(undefined8 *)(uVar21 + 0x78);
        fStack_92c = (float)((ulong)*(undefined8 *)(uVar21 + 0x78) >> 0x20);
        auVar48._0_4_ =
             fVar8 * *(float *)(uVar21 + 0x40) +
             fVar9 * local_938 + fVar10 * *(float *)(uVar21 + 0xa0);
        auVar48._4_4_ =
             fVar8 * *(float *)(uVar21 + 0x44) +
             fVar9 * fStack_934 + fVar10 * *(float *)(uVar21 + 0xa4);
        auVar48._8_4_ =
             fVar8 * *(float *)(uVar21 + 0x48) +
             fVar9 * fStack_930 + fVar10 * *(float *)(uVar21 + 0xa8);
        auVar48._12_4_ =
             fVar8 * *(float *)(uVar21 + 0x4c) +
             fVar9 * fStack_92c + fVar10 * *(float *)(uVar21 + 0xac);
        auVar37._4_4_ = -(uint)(ABS(auVar48._4_4_) < fVar78);
        auVar37._0_4_ = -(uint)(ABS(auVar48._0_4_) < fVar77);
        auVar37._8_4_ = -(uint)(ABS(auVar48._8_4_) < fVar79);
        auVar37._12_4_ = -(uint)(ABS(auVar48._12_4_) < fVar80);
        auVar57 = blendvps(auVar48,_DAT_01f80d30,auVar37);
        auVar35 = rcpps(auVar37,auVar59);
        fVar77 = auVar35._0_4_;
        fVar80 = auVar35._4_4_;
        fVar94 = auVar35._8_4_;
        fVar95 = auVar35._12_4_;
        fVar77 = (1.0 - auVar59._0_4_ * fVar77) * fVar77 + fVar77;
        fVar80 = (1.0 - auVar59._4_4_ * fVar80) * fVar80 + fVar80;
        fVar94 = (1.0 - auVar59._8_4_ * fVar94) * fVar94 + fVar94;
        fVar95 = (1.0 - auVar59._12_4_ * fVar95) * fVar95 + fVar95;
        auVar35 = rcpps(auVar35,auVar67);
        fVar78 = auVar35._0_4_;
        auVar68._0_4_ = auVar67._0_4_ * fVar78;
        fVar62 = auVar35._4_4_;
        auVar68._4_4_ = auVar67._4_4_ * fVar62;
        fVar63 = auVar35._8_4_;
        auVar68._8_4_ = auVar67._8_4_ * fVar63;
        fVar64 = auVar35._12_4_;
        auVar68._12_4_ = auVar67._12_4_ * fVar64;
        fVar78 = (1.0 - auVar68._0_4_) * fVar78 + fVar78;
        fVar62 = (1.0 - auVar68._4_4_) * fVar62 + fVar62;
        fVar63 = (1.0 - auVar68._8_4_) * fVar63 + fVar63;
        fVar64 = (1.0 - auVar68._12_4_) * fVar64 + fVar64;
        auVar35 = rcpps(auVar68,auVar57);
        fVar79 = auVar35._0_4_;
        fVar39 = auVar35._4_4_;
        fVar40 = auVar35._8_4_;
        fVar41 = auVar35._12_4_;
        fVar79 = (1.0 - auVar57._0_4_ * fVar79) * fVar79 + fVar79;
        fVar39 = (1.0 - auVar57._4_4_ * fVar39) * fVar39 + fVar39;
        fVar40 = (1.0 - auVar57._8_4_ * fVar40) * fVar40 + fVar40;
        fVar41 = (1.0 - auVar57._12_4_ * fVar41) * fVar41 + fVar41;
        fVar43 = *(float *)(uVar21 + 0x20) * fVar5 +
                 *(float *)(uVar21 + 0x50) * fVar6 +
                 *(float *)(uVar21 + 0x80) * fVar7 + *(float *)(uVar21 + 0xb0);
        fVar50 = *(float *)(uVar21 + 0x24) * fVar5 +
                 *(float *)(uVar21 + 0x54) * fVar6 +
                 *(float *)(uVar21 + 0x84) * fVar7 + *(float *)(uVar21 + 0xb4);
        fVar52 = *(float *)(uVar21 + 0x28) * fVar5 +
                 *(float *)(uVar21 + 0x58) * fVar6 +
                 *(float *)(uVar21 + 0x88) * fVar7 + *(float *)(uVar21 + 0xb8);
        fVar54 = *(float *)(uVar21 + 0x2c) * fVar5 +
                 *(float *)(uVar21 + 0x5c) * fVar6 +
                 *(float *)(uVar21 + 0x8c) * fVar7 + *(float *)(uVar21 + 0xbc);
        fVar44 = *(float *)(uVar21 + 0x30) * fVar5 +
                 *(float *)(uVar21 + 0x60) * fVar6 +
                 *(float *)(uVar21 + 0x90) * fVar7 + *(float *)(uVar21 + 0xc0);
        fVar51 = *(float *)(uVar21 + 0x34) * fVar5 +
                 *(float *)(uVar21 + 100) * fVar6 +
                 *(float *)(uVar21 + 0x94) * fVar7 + *(float *)(uVar21 + 0xc4);
        fVar53 = *(float *)(uVar21 + 0x38) * fVar5 +
                 *(float *)(uVar21 + 0x68) * fVar6 +
                 *(float *)(uVar21 + 0x98) * fVar7 + *(float *)(uVar21 + 200);
        fVar55 = *(float *)(uVar21 + 0x3c) * fVar5 +
                 *(float *)(uVar21 + 0x6c) * fVar6 +
                 *(float *)(uVar21 + 0x9c) * fVar7 + *(float *)(uVar21 + 0xcc);
        fVar90 = *(float *)(uVar21 + 0x40) * fVar5 +
                 local_938 * fVar6 + *(float *)(uVar21 + 0xa0) * fVar7 + *(float *)(uVar21 + 0xd0);
        fVar91 = *(float *)(uVar21 + 0x44) * fVar5 +
                 fStack_934 * fVar6 + *(float *)(uVar21 + 0xa4) * fVar7 + *(float *)(uVar21 + 0xd4);
        fVar92 = *(float *)(uVar21 + 0x48) * fVar5 +
                 fStack_930 * fVar6 + *(float *)(uVar21 + 0xa8) * fVar7 + *(float *)(uVar21 + 0xd8);
        fVar93 = *(float *)(uVar21 + 0x4c) * fVar5 +
                 fStack_92c * fVar6 + *(float *)(uVar21 + 0xac) * fVar7 + *(float *)(uVar21 + 0xdc);
        auVar59._4_4_ = iVar11;
        auVar59._0_4_ = iVar11;
        auVar59._8_4_ = iVar11;
        auVar59._12_4_ = iVar11;
        fVar82 = ((*(float *)(uVar21 + 0xe0) * fVar13 + fVar72) - fVar43) * fVar77;
        fVar83 = ((*(float *)(uVar21 + 0xe4) * fVar13 + fVar72) - fVar50) * fVar80;
        fVar84 = ((*(float *)(uVar21 + 0xe8) * fVar13 + fVar72) - fVar52) * fVar94;
        fVar85 = ((*(float *)(uVar21 + 0xec) * fVar13 + fVar72) - fVar54) * fVar95;
        fVar77 = ((*(float *)(uVar21 + 0x110) * fVar13 + fVar71) - fVar43) * fVar77;
        fVar80 = ((*(float *)(uVar21 + 0x114) * fVar13 + fVar71) - fVar50) * fVar80;
        fVar94 = ((*(float *)(uVar21 + 0x118) * fVar13 + fVar71) - fVar52) * fVar94;
        fVar95 = ((*(float *)(uVar21 + 0x11c) * fVar13 + fVar71) - fVar54) * fVar95;
        auVar57._4_4_ = iVar12;
        auVar57._0_4_ = iVar12;
        auVar57._8_4_ = iVar12;
        auVar57._12_4_ = iVar12;
        fVar43 = ((*(float *)(uVar21 + 0xf0) * fVar13 + fVar72) - fVar44) * fVar78;
        fVar50 = ((*(float *)(uVar21 + 0xf4) * fVar13 + fVar72) - fVar51) * fVar62;
        fVar52 = ((*(float *)(uVar21 + 0xf8) * fVar13 + fVar72) - fVar53) * fVar63;
        fVar54 = ((*(float *)(uVar21 + 0xfc) * fVar13 + fVar72) - fVar55) * fVar64;
        fVar73 = ((fVar72 + *(float *)(uVar21 + 0x100) * fVar13) - fVar90) * fVar79;
        fVar74 = ((fVar72 + *(float *)(uVar21 + 0x104) * fVar13) - fVar91) * fVar39;
        fVar75 = ((fVar72 + *(float *)(uVar21 + 0x108) * fVar13) - fVar92) * fVar40;
        fVar72 = ((fVar72 + *(float *)(uVar21 + 0x10c) * fVar13) - fVar93) * fVar41;
        fVar78 = ((*(float *)(uVar21 + 0x120) * fVar13 + fVar71) - fVar44) * fVar78;
        fVar62 = ((*(float *)(uVar21 + 0x124) * fVar13 + fVar71) - fVar51) * fVar62;
        fVar63 = ((*(float *)(uVar21 + 0x128) * fVar13 + fVar71) - fVar53) * fVar63;
        fVar64 = ((*(float *)(uVar21 + 300) * fVar13 + fVar71) - fVar55) * fVar64;
        fVar79 = ((fVar13 * *(float *)(uVar21 + 0x130) + fVar71) - fVar90) * fVar79;
        fVar39 = ((fVar13 * *(float *)(uVar21 + 0x134) + fVar71) - fVar91) * fVar39;
        fVar40 = ((fVar13 * *(float *)(uVar21 + 0x138) + fVar71) - fVar92) * fVar40;
        fVar41 = ((fVar13 * *(float *)(uVar21 + 0x13c) + fVar71) - fVar93) * fVar41;
        auVar49._0_4_ =
             (uint)((int)fVar78 < (int)fVar43) * (int)fVar78 |
             (uint)((int)fVar78 >= (int)fVar43) * (int)fVar43;
        auVar49._4_4_ =
             (uint)((int)fVar62 < (int)fVar50) * (int)fVar62 |
             (uint)((int)fVar62 >= (int)fVar50) * (int)fVar50;
        auVar49._8_4_ =
             (uint)((int)fVar63 < (int)fVar52) * (int)fVar63 |
             (uint)((int)fVar63 >= (int)fVar52) * (int)fVar52;
        auVar49._12_4_ =
             (uint)((int)fVar64 < (int)fVar54) * (int)fVar64 |
             (uint)((int)fVar64 >= (int)fVar54) * (int)fVar54;
        auVar38._0_4_ =
             (uint)((int)fVar79 < (int)fVar73) * (int)fVar79 |
             (uint)((int)fVar79 >= (int)fVar73) * (int)fVar73;
        auVar38._4_4_ =
             (uint)((int)fVar39 < (int)fVar74) * (int)fVar39 |
             (uint)((int)fVar39 >= (int)fVar74) * (int)fVar74;
        auVar38._8_4_ =
             (uint)((int)fVar40 < (int)fVar75) * (int)fVar40 |
             (uint)((int)fVar40 >= (int)fVar75) * (int)fVar75;
        auVar38._12_4_ =
             (uint)((int)fVar41 < (int)fVar72) * (int)fVar41 |
             (uint)((int)fVar41 >= (int)fVar72) * (int)fVar72;
        auVar67 = maxps(auVar49,auVar38);
        auVar61._0_4_ =
             (uint)((int)fVar77 < (int)fVar82) * (int)fVar77 |
             (uint)((int)fVar77 >= (int)fVar82) * (int)fVar82;
        auVar61._4_4_ =
             (uint)((int)fVar80 < (int)fVar83) * (int)fVar80 |
             (uint)((int)fVar80 >= (int)fVar83) * (int)fVar83;
        auVar61._8_4_ =
             (uint)((int)fVar94 < (int)fVar84) * (int)fVar94 |
             (uint)((int)fVar94 >= (int)fVar84) * (int)fVar84;
        auVar61._12_4_ =
             (uint)((int)fVar95 < (int)fVar85) * (int)fVar95 |
             (uint)((int)fVar95 >= (int)fVar85) * (int)fVar85;
        auVar88._0_4_ =
             (uint)((int)fVar78 < (int)fVar43) * (int)fVar43 |
             (uint)((int)fVar78 >= (int)fVar43) * (int)fVar78;
        auVar88._4_4_ =
             (uint)((int)fVar62 < (int)fVar50) * (int)fVar50 |
             (uint)((int)fVar62 >= (int)fVar50) * (int)fVar62;
        auVar88._8_4_ =
             (uint)((int)fVar63 < (int)fVar52) * (int)fVar52 |
             (uint)((int)fVar63 >= (int)fVar52) * (int)fVar63;
        auVar88._12_4_ =
             (uint)((int)fVar64 < (int)fVar54) * (int)fVar54 |
             (uint)((int)fVar64 >= (int)fVar54) * (int)fVar64;
        auVar42._0_4_ =
             (uint)((int)fVar79 < (int)fVar73) * (int)fVar73 |
             (uint)((int)fVar79 >= (int)fVar73) * (int)fVar79;
        auVar42._4_4_ =
             (uint)((int)fVar39 < (int)fVar74) * (int)fVar74 |
             (uint)((int)fVar39 >= (int)fVar74) * (int)fVar39;
        auVar42._8_4_ =
             (uint)((int)fVar40 < (int)fVar75) * (int)fVar75 |
             (uint)((int)fVar40 >= (int)fVar75) * (int)fVar40;
        auVar42._12_4_ =
             (uint)((int)fVar41 < (int)fVar72) * (int)fVar72 |
             (uint)((int)fVar41 >= (int)fVar72) * (int)fVar41;
        auVar89 = minps(auVar88,auVar42);
        auVar35 = maxps(auVar59,auVar61);
        auVar59 = maxps(auVar35,auVar67);
        auVar35._4_4_ =
             (uint)((int)fVar80 < (int)fVar83) * (int)fVar83 |
             (uint)((int)fVar80 >= (int)fVar83) * (int)fVar80;
        auVar35._0_4_ =
             (uint)((int)fVar77 < (int)fVar82) * (int)fVar82 |
             (uint)((int)fVar77 >= (int)fVar82) * (int)fVar77;
        auVar35._8_4_ =
             (uint)((int)fVar94 < (int)fVar84) * (int)fVar84 |
             (uint)((int)fVar94 >= (int)fVar84) * (int)fVar94;
        auVar35._12_4_ =
             (uint)((int)fVar95 < (int)fVar85) * (int)fVar85 |
             (uint)((int)fVar95 >= (int)fVar85) * (int)fVar95;
        auVar35 = minps(auVar57,auVar35);
        auVar35 = minps(auVar35,auVar89);
        iVar29 = -(uint)(auVar59._0_4_ * 0.99999964 <= auVar35._0_4_ * 1.0000004);
        iVar30 = -(uint)(auVar59._4_4_ * 0.99999964 <= auVar35._4_4_ * 1.0000004);
        iVar31 = -(uint)(auVar59._8_4_ * 0.99999964 <= auVar35._8_4_ * 1.0000004);
        iVar32 = -(uint)(auVar59._12_4_ * 0.99999964 <= auVar35._12_4_ * 1.0000004);
      }
      else {
        pfVar3 = (float *)(uVar21 + 0x80 + uVar27);
        pfVar1 = (float *)(uVar21 + 0x20 + uVar27);
        pfVar4 = (float *)(uVar21 + 0x80 + uVar24);
        pfVar2 = (float *)(uVar21 + 0x20 + uVar24);
        auVar45._0_4_ = ((*pfVar3 * fVar13 + *pfVar1) - fVar5) * fVar86;
        auVar45._4_4_ = ((pfVar3[1] * fVar13 + pfVar1[1]) - fVar5) * fVar86;
        auVar45._8_4_ = ((pfVar3[2] * fVar13 + pfVar1[2]) - fVar5) * fVar86;
        auVar45._12_4_ = ((pfVar3[3] * fVar13 + pfVar1[3]) - fVar5) * fVar86;
        auVar56._0_4_ = ((*pfVar4 * fVar13 + *pfVar2) - fVar6) * fVar87;
        auVar56._4_4_ = ((pfVar4[1] * fVar13 + pfVar2[1]) - fVar6) * fVar87;
        auVar56._8_4_ = ((pfVar4[2] * fVar13 + pfVar2[2]) - fVar6) * fVar87;
        auVar56._12_4_ = ((pfVar4[3] * fVar13 + pfVar2[3]) - fVar6) * fVar87;
        pfVar2 = (float *)(uVar21 + 0x80 + uVar28);
        pfVar1 = (float *)(uVar21 + 0x20 + uVar28);
        auVar33._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar7) * fVar81;
        auVar33._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar7) * fVar81;
        auVar33._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar7) * fVar81;
        auVar33._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar7) * fVar81;
        auVar57 = maxps(auVar56,auVar33);
        auVar34._4_4_ = iVar11;
        auVar34._0_4_ = iVar11;
        auVar34._8_4_ = iVar11;
        auVar34._12_4_ = iVar11;
        auVar35 = maxps(auVar34,auVar45);
        pfVar2 = (float *)(uVar21 + 0x80 + (uVar27 ^ 0x10));
        pfVar1 = (float *)(uVar21 + 0x20 + (uVar27 ^ 0x10));
        auVar35 = maxps(auVar35,auVar57);
        auVar65._0_4_ = ((*pfVar2 * fVar13 + *pfVar1) - fVar5) * fVar69;
        auVar65._4_4_ = ((pfVar2[1] * fVar13 + pfVar1[1]) - fVar5) * fVar69;
        auVar65._8_4_ = ((pfVar2[2] * fVar13 + pfVar1[2]) - fVar5) * fVar69;
        auVar65._12_4_ = ((pfVar2[3] * fVar13 + pfVar1[3]) - fVar5) * fVar69;
        pfVar3 = (float *)(uVar21 + 0x80 + (uVar24 ^ 0x10));
        pfVar1 = (float *)(uVar21 + 0x20 + (uVar24 ^ 0x10));
        pfVar4 = (float *)(uVar21 + 0x80 + (uVar28 ^ 0x10));
        pfVar2 = (float *)(uVar21 + 0x20 + (uVar28 ^ 0x10));
        auVar58._0_4_ = ((*pfVar3 * fVar13 + *pfVar1) - fVar6) * fVar70;
        auVar58._4_4_ = ((pfVar3[1] * fVar13 + pfVar1[1]) - fVar6) * fVar70;
        auVar58._8_4_ = ((pfVar3[2] * fVar13 + pfVar1[2]) - fVar6) * fVar70;
        auVar58._12_4_ = ((pfVar3[3] * fVar13 + pfVar1[3]) - fVar6) * fVar70;
        auVar46._0_4_ = ((*pfVar4 * fVar13 + *pfVar2) - fVar7) * fVar76;
        auVar46._4_4_ = ((pfVar4[1] * fVar13 + pfVar2[1]) - fVar7) * fVar76;
        auVar46._8_4_ = ((pfVar4[2] * fVar13 + pfVar2[2]) - fVar7) * fVar76;
        auVar46._12_4_ = ((pfVar4[3] * fVar13 + pfVar2[3]) - fVar7) * fVar76;
        auVar59 = minps(auVar58,auVar46);
        auVar47._4_4_ = iVar12;
        auVar47._0_4_ = iVar12;
        auVar47._8_4_ = iVar12;
        auVar47._12_4_ = iVar12;
        auVar57 = minps(auVar47,auVar65);
        auVar57 = minps(auVar57,auVar59);
        bVar16 = auVar35._0_4_ <= auVar57._0_4_;
        iVar29 = -(uint)bVar16;
        bVar17 = auVar35._4_4_ <= auVar57._4_4_;
        iVar30 = -(uint)bVar17;
        bVar18 = auVar35._8_4_ <= auVar57._8_4_;
        iVar31 = -(uint)bVar18;
        bVar19 = auVar35._12_4_ <= auVar57._12_4_;
        iVar32 = -(uint)bVar19;
        if (uVar22 == 6) {
          iVar29 = -(uint)((fVar13 < *(float *)(uVar21 + 0xf0) &&
                           *(float *)(uVar21 + 0xe0) <= fVar13) && bVar16);
          iVar30 = -(uint)((fVar13 < *(float *)(uVar21 + 0xf4) &&
                           *(float *)(uVar21 + 0xe4) <= fVar13) && bVar17);
          iVar31 = -(uint)((fVar13 < *(float *)(uVar21 + 0xf8) &&
                           *(float *)(uVar21 + 0xe8) <= fVar13) && bVar18);
          iVar32 = -(uint)((fVar13 < *(float *)(uVar21 + 0xfc) &&
                           *(float *)(uVar21 + 0xec) <= fVar13) && bVar19);
        }
      }
      auVar36._0_4_ = iVar29 << 0x1f;
      auVar36._4_4_ = iVar30 << 0x1f;
      auVar36._8_4_ = iVar31 << 0x1f;
      auVar36._12_4_ = iVar32 << 0x1f;
      uVar22 = movmskps(uVar22,auVar36);
      if (uVar22 == 0) goto LAB_0028897b;
      uVar22 = uVar22 & 0xff;
      lVar15 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
        }
      }
      uVar25 = *(ulong *)(uVar21 + lVar15 * 8);
      uVar22 = uVar22 - 1 & uVar22;
      if (uVar22 != 0) {
        *puVar26 = uVar25;
        puVar26 = puVar26 + 1;
        lVar15 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
          }
        }
        uVar25 = *(ulong *)(uVar21 + lVar15 * 8);
        uVar22 = uVar22 - 1 & uVar22;
        uVar23 = (ulong)uVar22;
        if (uVar22 != 0) {
          do {
            *puVar26 = uVar25;
            puVar26 = puVar26 + 1;
            lVar15 = 0;
            if (uVar23 != 0) {
              for (; (uVar23 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
              }
            }
            uVar25 = *(ulong *)(uVar21 + lVar15 * 8);
            uVar23 = uVar23 & uVar23 - 1;
          } while (uVar23 != 0);
        }
      }
    }
    cVar20 = (**(code **)((long)This->leafIntersector +
                         (ulong)*(byte *)(uVar25 & 0xfffffffffffffff0) * 0x40 + 0x18))
                       (pre,ray,k,context);
    if (cVar20 != '\0') {
      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
      return bVar14;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }